

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifsetoutfilter(bifcxdef *ctx,int argc)

{
  runsdef **pprVar1;
  uchar uVar2;
  runcxdef *prVar3;
  runsdef *prVar4;
  
  prVar3 = ctx->bifcxrun;
  uVar2 = prVar3->runcxsp[-1].runstyp;
  if (uVar2 == '\n') {
    prVar4 = prVar3->runcxsp + -1;
    prVar3->runcxsp = prVar4;
    if (prVar4->runstyp == '\n') {
      out_set_filter((ctx->bifcxrun->runcxsp->runsv).runsvobj);
      return;
    }
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f3);
  }
  if (uVar2 == '\x05') {
    out_set_filter(0xffff);
    pprVar1 = &ctx->bifcxrun->runcxsp;
    *pprVar1 = *pprVar1 + -1;
    return;
  }
  prVar3->runcxerr->errcxptr->erraav[0].errastr = "setOutputFilter";
  ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
  runsign(ctx->bifcxrun,0x3ff);
}

Assistant:

void bifsetoutfilter(bifcxdef *ctx, int argc)
{
    /* ensure we have the right number of arguments */
    bifcntargs(ctx, 1, argc);

    /* see what we have */
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_NIL:
        /* remove the current filter */
        out_set_filter(MCMONINV);

        /* discard the argument */
        rundisc(ctx->bifcxrun);
        break;

    case DAT_FNADDR:
        /* set the filter to the given function */
        out_set_filter(runpopfn(ctx->bifcxrun));
        break;

    default:
        /* anything else is invalid */
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "setOutputFilter");
    }
}